

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# poll.c
# Opt level: O2

void uv__poll_stop(uv_poll_t *handle)

{
  uint uVar1;
  uv_loop_t *loop;
  
  uv__io_stop(handle->loop,&handle->io_watcher,0x2007);
  uVar1 = handle->flags;
  if ((uVar1 & 4) == 0) {
    loop = handle->loop;
  }
  else {
    handle->flags = uVar1 & 0xfffffffb;
    loop = handle->loop;
    if ((uVar1 & 8) != 0) {
      loop->active_handles = loop->active_handles - 1;
    }
  }
  uv__platform_invalidate_fd(loop,(handle->io_watcher).fd);
  return;
}

Assistant:

static void uv__poll_stop(uv_poll_t* handle) {
  uv__io_stop(handle->loop,
              &handle->io_watcher,
              POLLIN | POLLOUT | UV__POLLRDHUP | UV__POLLPRI);
  uv__handle_stop(handle);
  uv__platform_invalidate_fd(handle->loop, handle->io_watcher.fd);
}